

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

fio_protocol_s * protocol_try_lock(intptr_t fd,fio_protocol_lock_e type)

{
  fio_protocol_s *pfVar1;
  int iVar2;
  int *piVar3;
  fio_protocol_s *pr;
  fio_protocol_lock_e type_local;
  intptr_t fd_local;
  
  piVar3 = __errno_location();
  *piVar3 = 0;
  iVar2 = fio_trylock((fio_lock_i *)((long)fio_data + fd * 0xa8 + 0x6c));
  if (iVar2 == 0) {
    pfVar1 = *(fio_protocol_s **)((long)fio_data + fd * 0xa8 + 0x58);
    if (pfVar1 == (fio_protocol_s *)0x0) {
      fio_unlock((fio_lock_i *)((long)fio_data + fd * 0xa8 + 0x6c));
      piVar3 = __errno_location();
      *piVar3 = 9;
      return (fio_protocol_s *)0x0;
    }
    iVar2 = fio_trylock((fio_lock_i *)((long)&pfVar1->rsv + (ulong)type));
    if (iVar2 == 0) {
      fio_unlock((fio_lock_i *)((long)fio_data + fd * 0xa8 + 0x6c));
      return pfVar1;
    }
    fio_unlock((fio_lock_i *)((long)fio_data + fd * 0xa8 + 0x6c));
  }
  piVar3 = __errno_location();
  *piVar3 = 0xb;
  return (fio_protocol_s *)0x0;
}

Assistant:

inline static fio_protocol_s *protocol_try_lock(intptr_t fd,
                                                enum fio_protocol_lock_e type) {
  errno = 0;
  if (fio_trylock(&fd_data(fd).protocol_lock))
    goto would_block;
  fio_protocol_s *pr = fd_data(fd).protocol;
  if (!pr) {
    fio_unlock(&fd_data(fd).protocol_lock);
    goto invalid;
  }
  if (fio_trylock(&prt_meta(pr).locks[type])) {
    fio_unlock(&fd_data(fd).protocol_lock);
    goto would_block;
  }
  fio_unlock(&fd_data(fd).protocol_lock);
  return pr;
would_block:
  errno = EWOULDBLOCK;
  return NULL;
invalid:
  errno = EBADF;
  return NULL;
}